

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::SingleArena_NullDefault_Test::SingleArena_NullDefault_Test
          (SingleArena_NullDefault_Test *this)

{
  SingleArena_NullDefault_Test *this_local;
  
  SingleArena::SingleArena(&this->super_SingleArena);
  (this->super_SingleArena).super_TestWithParam<bool>.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleArena_NullDefault_Test_029a27d8;
  (this->super_SingleArena).super_TestWithParam<bool>.super_WithParamInterface<bool>.
  _vptr_WithParamInterface = (_func_int **)&PTR__SingleArena_NullDefault_Test_029a2818;
  return;
}

Assistant:

TEST_P(SingleArena, NullDefault) {
  auto arena = GetArena();

  ArenaStringPtr field;
  field.InitDefault();
  std::string* mut = field.Mutable(nonempty_default, arena.get());
  EXPECT_EQ(mut, field.Mutable(nonempty_default, arena.get()));
  EXPECT_EQ(mut, &field.Get());
  EXPECT_NE(nullptr, mut);
  EXPECT_EQ("default", *mut);
  *mut = "Test long long long long value";  // ensure string allocates storage
  EXPECT_EQ("Test long long long long value", field.Get());
  field.Destroy();
}